

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField(MapFieldBase *this)

{
  Atomic32 AVar1;
  Atomic32 state;
  MapFieldBase *this_local;
  
  AVar1 = Acquire_Load(&this->state_);
  if (AVar1 == 1) {
    Mutex::Lock(&this->mutex_);
    if (this->state_ == 1) {
      (*this->_vptr_MapFieldBase[0xb])();
      Release_Store(&this->state_,2);
    }
    Mutex::Unlock(&this->mutex_);
  }
  return;
}

Assistant:

void MapFieldBase::SyncMapWithRepeatedField() const {
  // "Acquire" insures the operation after SyncMapWithRepeatedField won't get
  // executed before state_ is checked.
  Atomic32 state = google::protobuf::internal::Acquire_Load(&state_);
  if (state == STATE_MODIFIED_REPEATED) {
    mutex_.Lock();
    // Double check state, because another thread may have seen the same state
    // and done the synchronization before the current thread.
    if (state_ == STATE_MODIFIED_REPEATED) {
      SyncMapWithRepeatedFieldNoLock();
      // "Release" insures state_ can only be changed "after"
      // SyncRepeatedFieldWithMapNoLock is finished.
      google::protobuf::internal::Release_Store(&state_, CLEAN);
    }
    mutex_.Unlock();
  }
}